

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O3

void __thiscall CServerBrowser::RemoveRequest(CServerBrowser *this,CServerEntry *pEntry)

{
  CServerEntry *pCVar1;
  CServerEntry *pCVar2;
  CServerEntry **ppCVar3;
  
  pCVar1 = pEntry->m_pPrevReq;
  pCVar2 = pEntry->m_pNextReq;
  if (pCVar1 == (CServerEntry *)0x0) {
    ppCVar3 = &this->m_pFirstReqServer;
    if ((pCVar2 == (CServerEntry *)0x0) && (this->m_pFirstReqServer != pEntry)) {
      return;
    }
  }
  else {
    ppCVar3 = &pCVar1->m_pNextReq;
  }
  *ppCVar3 = pCVar2;
  ppCVar3 = &pCVar2->m_pPrevReq;
  if (pCVar2 == (CServerEntry *)0x0) {
    ppCVar3 = &this->m_pLastReqServer;
  }
  *ppCVar3 = pCVar1;
  pEntry->m_pPrevReq = (CServerEntry *)0x0;
  pEntry->m_pNextReq = (CServerEntry *)0x0;
  this->m_NumRequests = this->m_NumRequests + -1;
  return;
}

Assistant:

void CServerBrowser::RemoveRequest(CServerEntry *pEntry)
{
	if(pEntry->m_pPrevReq || pEntry->m_pNextReq || m_pFirstReqServer == pEntry)
	{
		if(pEntry->m_pPrevReq)
			pEntry->m_pPrevReq->m_pNextReq = pEntry->m_pNextReq;
		else
			m_pFirstReqServer = pEntry->m_pNextReq;

		if(pEntry->m_pNextReq)
			pEntry->m_pNextReq->m_pPrevReq = pEntry->m_pPrevReq;
		else
			m_pLastReqServer = pEntry->m_pPrevReq;

		pEntry->m_pPrevReq = 0;
		pEntry->m_pNextReq = 0;
		m_NumRequests--;
	}
}